

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_avx2.c
# Opt level: O2

void av1_resize_horz_dir_avx2
               (uint8_t *input,int in_stride,uint8_t *intbuf,int height,int filtered_length,
               int width2)

{
  undefined8 uVar1;
  int iVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  int row_offset;
  int iVar29;
  int j;
  int iVar30;
  int iVar31;
  undefined1 (*pauVar32) [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  __m256i s0 [4];
  __m256i s1 [4];
  __m256i coeffs_x [4];
  longlong local_2c0;
  longlong lStack_2b8;
  longlong lStack_2b0;
  longlong lStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  ulong local_278;
  long local_270;
  long local_268;
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  longlong local_240;
  longlong lStack_238;
  longlong lStack_230;
  longlong lStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  __m256i local_200;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined8 local_180;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  __m256i local_160;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  longlong local_e0 [22];
  undefined1 auVar36 [32];
  undefined1 auVar40 [32];
  
  if (filtered_length < 0x20) {
    av1_resize_horz_dir_sse2(input,in_stride,intbuf,height,filtered_length,width2);
  }
  else {
    local_e0[8] = 0xc380c380c380c38;
    local_e0[9] = 0xc380c380c380c38;
    local_e0[10] = 0xc380c380c380c38;
    local_e0[0xb] = 0xc380c380c380c38;
    local_e0[0xc] = 0xfffdfffdfffdfffd;
    local_e0[0xd] = 0xfffdfffdfffdfffd;
    local_e0[0xe] = 0xfffdfffdfffdfffd;
    local_e0[0xf] = 0xfffdfffdfffdfffd;
    local_e0[0] = -0x200020002000201;
    local_e0[1] = -0x200020002000201;
    local_e0[2] = -0x200020002000201;
    local_e0[3] = -0x200020002000201;
    local_e0[4] = 0x380c380c380c380c;
    local_e0[5] = 0x380c380c380c380c;
    local_e0[6] = 0x380c380c380c380c;
    local_e0[7] = 0x380c380c380c380c;
    if ((filtered_length & 0x1fU) == 0) {
      iVar17 = in_stride * 2;
      uVar23 = (ulong)(uint)filtered_length - 0x20;
      iVar31 = 0;
      local_180._0_4_ = 0x40;
      local_180._4_4_ = 0x40;
      uStack_178 = 0x40;
      uStack_174 = 0x40;
      uStack_170 = 0x40;
      uStack_16c = 0x40;
      uStack_168 = 0x40;
      uStack_164 = 0x40;
      lVar18 = 0;
      while (lVar18 < height) {
        local_260 = (undefined4)lVar18;
        uStack_25c = (undefined4)((ulong)lVar18 >> 0x20);
        iVar29 = 0;
        iVar30 = 0;
        pauVar32 = (undefined1 (*) [16])intbuf;
        for (uVar26 = 0; uVar26 < (uint)filtered_length; uVar26 = uVar26 + 0x20) {
          iVar21 = (int)uVar26;
          local_200 = (__m256i)vperm2i128_avx2(*(undefined1 (*) [32])
                                                (input + (iVar31 + iVar21 + iVar30)),
                                               *(undefined1 (*) [32])
                                                (input + (in_stride + iVar21 + iVar30)),0x20);
          local_160 = (__m256i)vperm2i128_avx2(*(undefined1 (*) [32])
                                                (input + (iVar31 + iVar21 + iVar30)),
                                               *(undefined1 (*) [32])
                                                (input + (in_stride + iVar21 + iVar30)),0x31);
          if (uVar26 == 0) {
            local_160 = (__m256i)vpalignr_avx2((undefined1  [32])local_160,
                                               (undefined1  [32])local_200,0xd);
            local_200 = (__m256i)vpshufb_avx2((undefined1  [32])local_200,_DAT_004c9680);
          }
          if (uVar23 == uVar26) {
            iVar29 = 5;
          }
          auVar43._8_8_ = 0;
          auVar43._0_8_ = *(ulong *)(input + (((in_stride + iVar21) - iVar29) + 0x1d));
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)(input + (((iVar31 + iVar21) - iVar29) + 0x1d));
          auVar35._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar39;
          auVar35._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar43;
          if (uVar23 == uVar26) {
            auVar35 = vpshufb_avx2(auVar35,_DAT_004c96a0);
          }
          local_1e0 = vpalignr_avx2((undefined1  [32])local_160,(undefined1  [32])local_200,2);
          local_1c0 = vpalignr_avx2((undefined1  [32])local_160,(undefined1  [32])local_200,4);
          local_1a0 = vpalignr_avx2((undefined1  [32])local_160,(undefined1  [32])local_200,6);
          local_140 = vpalignr_avx2(auVar35,(undefined1  [32])local_160,2);
          local_120 = vpalignr_avx2(auVar35,(undefined1  [32])local_160,4);
          local_100 = vpalignr_avx2(auVar35,(undefined1  [32])local_160,6);
          local_220 = 0;
          uStack_218 = 0;
          uStack_210 = 0;
          uStack_208 = 0;
          local_240 = 0;
          lStack_238 = 0;
          lStack_230 = 0;
          lStack_228 = 0;
          local_2c0 = 0;
          lStack_2b8 = 0;
          lStack_2b0 = 0;
          lStack_2a8 = 0;
          local_2a0 = 0;
          uStack_298 = 0;
          uStack_290 = 0;
          uStack_288 = 0;
          resize_convolve(&local_200,(__m256i *)local_e0,(__m256i *)&local_2c0);
          resize_convolve(&local_160,(__m256i *)local_e0,(__m256i *)&local_240);
          auVar16._4_4_ = local_180._4_4_;
          auVar16._0_4_ = (undefined4)local_180;
          auVar16._8_4_ = uStack_178;
          auVar16._12_4_ = uStack_174;
          auVar16._16_4_ = uStack_170;
          auVar16._20_4_ = uStack_16c;
          auVar16._24_4_ = uStack_168;
          auVar16._28_4_ = uStack_164;
          auVar33._8_8_ = lStack_2b8;
          auVar33._0_8_ = local_2c0;
          auVar33._16_8_ = lStack_2b0;
          auVar33._24_8_ = lStack_2a8;
          auVar35 = vpaddd_avx2(auVar16,auVar33);
          auVar33 = vpsrad_avx2(auVar35,7);
          auVar13._8_8_ = lStack_238;
          auVar13._0_8_ = local_240;
          auVar13._16_8_ = lStack_230;
          auVar13._24_8_ = lStack_228;
          auVar35 = vpaddd_avx2(auVar16,auVar13);
          auVar35 = vpsrad_avx2(auVar35,7);
          auVar35 = vpackusdw_avx2(auVar33,auVar35);
          auVar41._8_8_ = uStack_298;
          auVar41._0_8_ = local_2a0;
          auVar41._16_8_ = uStack_290;
          auVar41._24_8_ = uStack_288;
          auVar33 = vpaddd_avx2(auVar16,auVar41);
          auVar15._8_8_ = uStack_218;
          auVar15._0_8_ = local_220;
          auVar15._16_8_ = uStack_210;
          auVar15._24_8_ = uStack_208;
          auVar41 = vpaddd_avx2(auVar16,auVar15);
          auVar33 = vpsrad_avx2(auVar33,7);
          auVar41 = vpsrad_avx2(auVar41,7);
          auVar33 = vpackusdw_avx2(auVar33,auVar41);
          auVar35 = vpackuswb_avx2(auVar35,auVar33);
          auVar39 = vpunpckldq_avx(auVar35._0_16_,auVar35._16_16_);
          *pauVar32 = auVar39;
          auVar39 = vpunpckhdq_avx(auVar35._0_16_,auVar35._16_16_);
          *(undefined1 (*) [16])(*pauVar32 + width2) = auVar39;
          pauVar32 = pauVar32 + 1;
          iVar30 = -3;
        }
        in_stride = in_stride + iVar17;
        iVar31 = iVar31 + iVar17;
        intbuf = *(undefined1 (*) [16])intbuf + (long)width2 * 2;
        lVar18 = CONCAT44(uStack_25c,local_260) + 2;
      }
    }
    else {
      lVar18 = (long)width2;
      local_270 = (long)height;
      uVar26 = (ulong)(uint)in_stride;
      local_278 = (ulong)(uint)(in_stride * 2);
      iVar17 = filtered_length + -0x10;
      lVar27 = 0;
      local_260 = 0x40;
      uStack_25c = 0x40;
      uStack_258 = 0x40;
      uStack_254 = 0x40;
      uStack_250 = 0x40;
      uStack_24c = 0x40;
      uStack_248 = 0x40;
      uStack_244 = 0x40;
      for (uVar23 = 0; (long)uVar23 < local_270; uVar23 = uVar23 + 2) {
        lVar19 = uVar23 * (long)in_stride;
        lVar22 = uVar23 * lVar18;
        local_180 = intbuf + (uVar23 | 1) * lVar18;
        bVar20 = true;
        lVar28 = 0;
        uVar25 = 0;
        iVar29 = 0;
        iVar31 = 0;
        local_268 = lVar22;
        iVar30 = filtered_length;
        while( true ) {
          iVar24 = (int)uVar25;
          iVar21 = (int)lVar27;
          iVar2 = (int)uVar26;
          if (filtered_length - 0x20 < uVar25) break;
          if ((iVar30 == 0x22) || (iVar30 == 0x24)) goto LAB_003d1613;
          local_200 = (__m256i)vperm2i128_avx2(*(undefined1 (*) [32])
                                                (input + ((iVar21 + iVar24) - iVar31)),
                                               *(undefined1 (*) [32])
                                                (input + ((iVar2 + iVar24) - iVar31)),0x20);
          local_160 = (__m256i)vperm2i128_avx2(*(undefined1 (*) [32])
                                                (input + ((iVar21 + iVar24) - iVar31)),
                                               *(undefined1 (*) [32])
                                                (input + ((iVar2 + iVar24) - iVar31)),0x31);
          if (uVar25 == 0) {
            local_160 = (__m256i)vpalignr_avx2((undefined1  [32])local_160,
                                               (undefined1  [32])local_200,0xd);
            local_200 = (__m256i)vpshufb_avx2((undefined1  [32])local_200,_DAT_004c9680);
          }
          if ((0x20 - (ulong)(uint)filtered_length) + uVar25 == 0) {
            iVar29 = 5;
          }
          auVar42._8_8_ = 0;
          auVar42._0_8_ = *(ulong *)(input + (((iVar2 + iVar24) - iVar29) + 0x1d));
          auVar37._8_8_ = 0;
          auVar37._0_8_ = *(ulong *)(input + (((iVar21 + iVar24) - iVar29) + 0x1d));
          auVar40._0_16_ = ZEXT116(0) * auVar42 + ZEXT116(1) * auVar37;
          auVar40._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar42;
          if ((0x20 - (ulong)(uint)filtered_length) + uVar25 == 0) {
            auVar40 = vpshufb_avx2(auVar40,_DAT_004c96a0);
          }
          local_1e0 = vpalignr_avx2((undefined1  [32])local_160,(undefined1  [32])local_200,2);
          local_1c0 = vpalignr_avx2((undefined1  [32])local_160,(undefined1  [32])local_200,4);
          local_1a0 = vpalignr_avx2((undefined1  [32])local_160,(undefined1  [32])local_200,6);
          local_140 = vpalignr_avx2(auVar40,(undefined1  [32])local_160,2);
          local_120 = vpalignr_avx2(auVar40,(undefined1  [32])local_160,4);
          local_100 = vpalignr_avx2(auVar40,(undefined1  [32])local_160,6);
          local_220 = 0;
          uStack_218 = 0;
          uStack_210 = 0;
          uStack_208 = 0;
          local_240 = 0;
          lStack_238 = 0;
          lStack_230 = 0;
          lStack_228 = 0;
          local_2c0 = 0;
          lStack_2b8 = 0;
          lStack_2b0 = 0;
          lStack_2a8 = 0;
          local_2a0 = 0;
          uStack_298 = 0;
          uStack_290 = 0;
          uStack_288 = 0;
          resize_convolve(&local_200,(__m256i *)local_e0,(__m256i *)&local_2c0);
          resize_convolve(&local_160,(__m256i *)local_e0,(__m256i *)&local_240);
          auVar9._4_4_ = uStack_25c;
          auVar9._0_4_ = local_260;
          auVar9._8_4_ = uStack_258;
          auVar9._12_4_ = uStack_254;
          auVar9._16_4_ = uStack_250;
          auVar9._20_4_ = uStack_24c;
          auVar9._24_4_ = uStack_248;
          auVar9._28_4_ = uStack_244;
          auVar3._8_8_ = lStack_2b8;
          auVar3._0_8_ = local_2c0;
          auVar3._16_8_ = lStack_2b0;
          auVar3._24_8_ = lStack_2a8;
          auVar35 = vpaddd_avx2(auVar9,auVar3);
          auVar33 = vpsrad_avx2(auVar35,7);
          auVar12._8_8_ = lStack_238;
          auVar12._0_8_ = local_240;
          auVar12._16_8_ = lStack_230;
          auVar12._24_8_ = lStack_228;
          auVar35 = vpaddd_avx2(auVar9,auVar12);
          auVar35 = vpsrad_avx2(auVar35,7);
          auVar35 = vpackusdw_avx2(auVar33,auVar35);
          auVar6._8_8_ = uStack_298;
          auVar6._0_8_ = local_2a0;
          auVar6._16_8_ = uStack_290;
          auVar6._24_8_ = uStack_288;
          auVar33 = vpaddd_avx2(auVar9,auVar6);
          auVar14._8_8_ = uStack_218;
          auVar14._0_8_ = local_220;
          auVar14._16_8_ = uStack_210;
          auVar14._24_8_ = uStack_208;
          auVar41 = vpaddd_avx2(auVar9,auVar14);
          auVar33 = vpsrad_avx2(auVar33,7);
          auVar41 = vpsrad_avx2(auVar41,7);
          auVar33 = vpackusdw_avx2(auVar33,auVar41);
          auVar35 = vpackuswb_avx2(auVar35,auVar33);
          auVar39 = vpunpckldq_avx(auVar35._0_16_,auVar35._16_16_);
          *(undefined1 (*) [16])(intbuf + (lVar28 >> 0x20) + lVar22) = auVar39;
          auVar39 = vpunpckhdq_avx(auVar35._0_16_,auVar35._16_16_);
          *(undefined1 (*) [16])(local_180 + (lVar28 >> 0x20)) = auVar39;
          iVar30 = iVar30 + -0x20;
          lVar28 = lVar28 + 0x1000000000;
          uVar25 = uVar25 + 0x20;
          bVar20 = false;
          iVar31 = 3;
        }
        if (iVar30 < 0x10) {
LAB_003d1772:
          if (7 < iVar30) goto LAB_003d177c;
LAB_003d18ad:
          if (iVar30 != 0) goto LAB_003d18b2;
        }
        else {
          if ((iVar30 != 0x12) && (iVar30 != 0x14)) {
LAB_003d1613:
            local_200._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(input + ((iVar2 - iVar31) + iVar24)) +
                 ZEXT116(1) * *(undefined1 (*) [16])(input + ((iVar21 - iVar31) + iVar24));
            local_200._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * *(undefined1 (*) [16])(input + ((iVar2 - iVar31) + iVar24));
            if (bVar20) {
              local_200 = (__m256i)vpshufb_avx2((undefined1  [32])local_200,_DAT_004c9680);
            }
            if (iVar17 == iVar24) {
              iVar29 = 5;
            }
            auVar38._8_8_ = 0;
            auVar38._0_8_ = *(ulong *)(input + (long)((iVar2 - iVar29) + 0x10 + iVar24) + -3);
            auVar34._8_8_ = 0;
            auVar34._0_8_ = *(ulong *)(input + (long)((iVar21 - iVar29) + iVar24 + 0x10) + -3);
            auVar36._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar34;
            auVar36._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar38;
            if (iVar17 == iVar24) {
              auVar36 = vpshufb_avx2(auVar36,_DAT_004c96a0);
            }
            iVar30 = iVar17 - iVar24;
            iVar31 = (int)((long)((ulong)(uint)(iVar24 >> 0x1f) << 0x20 | uVar25 & 0xffffffff) / 2)
                     + (int)local_268;
            local_1e0 = vpalignr_avx2(auVar36,(undefined1  [32])local_200,2);
            local_1c0 = vpalignr_avx2(auVar36,(undefined1  [32])local_200,4);
            local_1a0 = vpalignr_avx2(auVar36,(undefined1  [32])local_200,6);
            local_2a0 = 0;
            uStack_298 = 0;
            uStack_290 = 0;
            uStack_288 = 0;
            local_2c0 = 0;
            lStack_2b8 = 0;
            lStack_2b0 = 0;
            lStack_2a8 = 0;
            resize_convolve(&local_200,(__m256i *)local_e0,(__m256i *)&local_2c0);
            auVar10._4_4_ = uStack_25c;
            auVar10._0_4_ = local_260;
            auVar10._8_4_ = uStack_258;
            auVar10._12_4_ = uStack_254;
            auVar10._16_4_ = uStack_250;
            auVar10._20_4_ = uStack_24c;
            auVar10._24_4_ = uStack_248;
            auVar10._28_4_ = uStack_244;
            auVar4._8_8_ = lStack_2b8;
            auVar4._0_8_ = local_2c0;
            auVar4._16_8_ = lStack_2b0;
            auVar4._24_8_ = lStack_2a8;
            auVar35 = vpaddd_avx2(auVar10,auVar4);
            auVar33 = vpsrad_avx2(auVar35,7);
            auVar7._8_8_ = uStack_298;
            auVar7._0_8_ = local_2a0;
            auVar7._16_8_ = uStack_290;
            auVar7._24_8_ = uStack_288;
            auVar35 = vpaddd_avx2(auVar10,auVar7);
            auVar35 = vpsrad_avx2(auVar35,7);
            auVar35 = vpackusdw_avx2(auVar33,auVar35);
            auVar35 = vpackuswb_avx2(auVar35,auVar35);
            auVar39 = vpunpckldq_avx(auVar35._0_16_,auVar35._16_16_);
            *(long *)(intbuf + iVar31) = auVar39._0_8_;
            uVar1 = vpextrq_avx(auVar39,1);
            *(undefined8 *)(intbuf + (iVar31 + width2)) = uVar1;
            iVar31 = 3;
            goto LAB_003d1772;
          }
LAB_003d177c:
          if ((iVar30 != 10) && (iVar30 != 0xc)) {
            iVar21 = filtered_length - iVar30;
            iVar31 = ((int)lVar19 - iVar31) + iVar21;
            if (iVar21 + 8 == filtered_length) {
              iVar29 = 5;
            }
            local_200._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(input + ((iVar31 + in_stride) - iVar29)) +
                 ZEXT116(1) * *(undefined1 (*) [16])(input + (iVar31 - iVar29));
            local_200._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * *(undefined1 (*) [16])(input + ((iVar31 + in_stride) - iVar29));
            if (iVar21 + 8 == filtered_length) {
              local_200 = (__m256i)vpshufb_avx2((undefined1  [32])local_200,_DAT_004c96c0);
            }
            iVar30 = iVar30 + -8;
            local_1e0 = vpsrldq_avx2((undefined1  [32])local_200,2);
            local_1c0 = vpsrldq_avx2((undefined1  [32])local_200,4);
            local_1a0 = vpsrldq_avx2((undefined1  [32])local_200,6);
            local_2a0 = 0;
            uStack_298 = 0;
            uStack_290 = 0;
            uStack_288 = 0;
            local_2c0 = 0;
            lStack_2b8 = 0;
            lStack_2b0 = 0;
            lStack_2a8 = 0;
            resize_convolve(&local_200,(__m256i *)local_e0,(__m256i *)&local_2c0);
            auVar5._8_8_ = lStack_2b8;
            auVar5._0_8_ = local_2c0;
            auVar5._16_8_ = lStack_2b0;
            auVar5._24_8_ = lStack_2a8;
            auVar8._8_8_ = uStack_298;
            auVar8._0_8_ = local_2a0;
            auVar8._16_8_ = uStack_290;
            auVar8._24_8_ = uStack_288;
            auVar35 = vperm2i128_avx2(auVar5,auVar8,0x20);
            auVar11._4_4_ = uStack_25c;
            auVar11._0_4_ = local_260;
            auVar11._8_4_ = uStack_258;
            auVar11._12_4_ = uStack_254;
            auVar11._16_4_ = uStack_250;
            auVar11._20_4_ = uStack_24c;
            auVar11._24_4_ = uStack_248;
            auVar11._28_4_ = uStack_244;
            auVar35 = vpaddd_avx2(auVar35,auVar11);
            auVar35 = vpsrad_avx2(auVar35,7);
            auVar35 = vpackusdw_avx2(auVar35,auVar35);
            auVar35 = vpackuswb_avx2(auVar35,auVar35);
            *(int *)(intbuf + iVar21 / 2 + lVar22) = auVar35._0_4_;
            *(int *)(intbuf + lVar18 + iVar21 / 2 + lVar22) = auVar35._16_4_;
            goto LAB_003d18ad;
          }
LAB_003d18b2:
          iVar30 = filtered_length - iVar30;
          down2_symeven(input + lVar19,filtered_length,intbuf + iVar30 / 2 + lVar22,iVar30);
          down2_symeven(input + lVar19 + in_stride,filtered_length,
                        intbuf + iVar30 / 2 + lVar22 + lVar18,iVar30);
        }
        uVar26 = uVar26 + local_278;
        lVar27 = lVar27 + local_278;
      }
    }
  }
  return;
}

Assistant:

void av1_resize_horz_dir_avx2(const uint8_t *const input, int in_stride,
                              uint8_t *intbuf, int height, int filtered_length,
                              int width2) {
  assert(height % 2 == 0);
  // Invoke SSE2 for width less than 32.
  if (filtered_length < 32) {
    av1_resize_horz_dir_sse2(input, in_stride, intbuf, height, filtered_length,
                             width2);
    return;
  }

  const int filt_length = sizeof(av1_down2_symeven_half_filter);
  assert(filt_length % 2 == 0);
  (void)filt_length;

  __m256i s0[4], s1[4], coeffs_x[4];

  const int bits = FILTER_BITS;
  const int dst_stride = width2;
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m256i round_const_bits = _mm256_set1_epi32((1 << bits) >> 1);

  const uint8_t max_pixel = 255;
  const __m256i clip_pixel = _mm256_set1_epi8((char)max_pixel);
  const __m256i zero = _mm256_setzero_si256();

  const __m256i wd32_start_pad_mask =
      _mm256_loadu_si256((__m256i *)wd32_left_padding_mask);
  const __m256i wd32_end_pad_mask =
      _mm256_loadu_si256((__m256i *)wd32_right_padding_mask);
  const __m256i wd8_end_pad_mask =
      _mm256_loadu_si256((__m256i *)wd8_right_padding_mask);
  prepare_filter_coeffs(av1_down2_symeven_half_filter, coeffs_x);

  // The core horizontal SIMD processes 32 input pixels of 2 rows simultaneously
  // to generate output corresponding to 2 rows. To streamline the core loop and
  // eliminate the need for conditional checks, the remaining columns (16 or 8)
  // are processed separately.
  if (filtered_length % 32 == 0) {
    for (int i = 0; i < height; i += 2) {
      int filter_offset = 0;
      int row_offset = 0;
      for (int j = 0; j < filtered_length; j += 32) {
        PROCESS_RESIZE_X_WD32
      }
    }
  } else {
    for (int i = 0; i < height; i += 2) {
      int filter_offset = 0;
      int remain_col = filtered_length;
      int row_offset = 0;
      // To avoid pixel over-read at frame boundary, processing of 32 pixels
      // is done using the core loop only if sufficient number of pixels
      // required for the load are present. The remaining pixels are processed
      // separately.
      for (int j = 0; j <= filtered_length - 32; j += 32) {
        if (remain_col == 34 || remain_col == 36) {
          break;
        }
        PROCESS_RESIZE_X_WD32
        remain_col -= 32;
      }

      int wd_processed = filtered_length - remain_col;
      // To avoid pixel over-read at frame boundary, processing of 16 pixels
      // is done only if sufficient number of pixels required for the
      // load are present. The remaining pixels are processed separately.
      if (remain_col > 15 && remain_col != 18 && remain_col != 20) {
        remain_col = filtered_length - wd_processed - 16;
        const int in_idx = i * in_stride + wd_processed;
        const int out_idx = (i * dst_stride) + wd_processed / 2;
        // a0 a1 --- a15
        __m128i row0 =
            _mm_loadu_si128((__m128i *)&input[in_idx - filter_offset]);
        // b0 b1 --- b15
        __m128i row1 = _mm_loadu_si128(
            (__m128i *)&input[in_idx + in_stride - filter_offset]);
        // a0 a1 --- a15 || b0 b1 --- b15
        __m256i r0 =
            _mm256_permute2x128_si256(CAST_HI(row0), CAST_HI(row1), 0x20);
        if (filter_offset == 0) {
          r0 = _mm256_shuffle_epi8(r0, wd32_start_pad_mask);
        }
        filter_offset = 3;
        const int is_last_cols16 = wd_processed + 16 == filtered_length;
        if (is_last_cols16) row_offset = ROW_OFFSET;

        // a16 a17 --- a23
        row0 = _mm_loadl_epi64(
            (__m128i *)&input[in_idx + 16 - row_offset - filter_offset]);
        // b16 b17 --- b23
        row1 = _mm_loadl_epi64((__m128i *)&input[in_idx + 16 + in_stride -
                                                 row_offset - filter_offset]);

        // a16-a23 x x x x| b16-b23 x x x x
        __m256i r1 =
            _mm256_permute2x128_si256(CAST_HI(row0), CAST_HI(row1), 0x20);

        // Pad end pixels to the right, while processing the last pixels in the
        // row.
        if (is_last_cols16) {
          r1 = _mm256_shuffle_epi8(_mm256_srli_si256(r1, ROW_OFFSET),
                                   wd32_end_pad_mask);
        }

        // a0 a1 --- a15 || b0 b1 --- b15
        s0[0] = r0;
        // a2 a3 --- a17 || b2 b3 --- b17
        s0[1] = _mm256_alignr_epi8(r1, r0, 2);
        // a4 a5 --- a19 || b4 b5 --- b19
        s0[2] = _mm256_alignr_epi8(r1, r0, 4);
        // a6 a7 --- a21 || b6 b7 --- b21
        s0[3] = _mm256_alignr_epi8(r1, r0, 6);

        // result for 16 pixels (a0 to a15) of row0 and row1
        __m256i res_out_0[2];
        res_out_0[0] = res_out_0[1] = zero;
        resize_convolve(s0, coeffs_x, res_out_0);

        // r00-r07
        res_out_0[0] = _mm256_sra_epi32(
            _mm256_add_epi32(res_out_0[0], round_const_bits), round_shift_bits);
        // r10-r17
        res_out_0[1] = _mm256_sra_epi32(
            _mm256_add_epi32(res_out_0[1], round_const_bits), round_shift_bits);
        // r00-r03 r10-r13 r04-r07 r14-r17
        __m256i res_out_row01 = _mm256_packus_epi32(res_out_0[0], res_out_0[1]);
        // r00-r03 r10-r13 r00-r03 r10-r13 | r04-r07 r14-r17 r04-r07 r14-r17
        res_out_row01 = _mm256_packus_epi16(res_out_row01, res_out_row01);
        res_out_row01 = _mm256_min_epu8(res_out_row01, clip_pixel);
        res_out_row01 = _mm256_max_epu8(res_out_row01, zero);
        // r00-r03 r10-r13 r04-r07 r14-r17
        __m128i low_result =
            CAST_LOW(_mm256_permute4x64_epi64(res_out_row01, 0xd8));
        // r00-r03 r04-r07 r10-r13 r14-r17
        low_result = _mm_shuffle_epi32(low_result, 0xd8);

        _mm_storel_epi64((__m128i *)&intbuf[out_idx], low_result);
        _mm_storel_epi64((__m128i *)&intbuf[out_idx + dst_stride],
                         _mm_unpackhi_epi64(low_result, low_result));
      }

      // To avoid pixel over-read at frame boundary, processing of 8 pixels
      // is done only if sufficient number of pixels required for the
      // load are present. The remaining pixels are processed by C function.
      wd_processed = filtered_length - remain_col;
      if (remain_col > 7 && remain_col != 10 && remain_col != 12) {
        remain_col = filtered_length - wd_processed - 8;
        const int in_idx = i * in_stride + wd_processed - filter_offset;
        const int out_idx = (i * dst_stride) + wd_processed / 2;
        const int is_last_cols_8 = wd_processed + 8 == filtered_length;
        if (is_last_cols_8) row_offset = ROW_OFFSET;
        // a0 a1 --- a15
        __m128i row0 = _mm_loadu_si128((__m128i *)&input[in_idx - row_offset]);
        // b0 b1 --- b15
        __m128i row1 =
            _mm_loadu_si128((__m128i *)&input[in_idx + in_stride - row_offset]);
        // a0 a1 --- a15 || b0 b1 --- b15
        __m256i r0 =
            _mm256_permute2x128_si256(CAST_HI(row0), CAST_HI(row1), 0x20);

        // Pad end pixels to the right, while processing the last pixels in the
        // row.
        if (is_last_cols_8)
          r0 = _mm256_shuffle_epi8(_mm256_srli_si256(r0, ROW_OFFSET),
                                   wd8_end_pad_mask);

        // a0 a1 a2 a3 a4 a5 a6 a7 | b0 b1 b2 b3 b4 b5 b6 b7
        s0[0] = r0;
        // a2 a3 a4 a5 a6 a7 a8 a9 | b2 b3 b4 b5 b6 b7 b8 b9
        s0[1] = _mm256_bsrli_epi128(r0, 2);
        // a4 a5 a6 a7 a8 a9 a10 a10 |  b4 b5 b6 b7 b8 b9 b10 b10
        s0[2] = _mm256_bsrli_epi128(r0, 4);
        // a6 a7 a8 a9 a10 a10 a10 a10 | b6 b7 b8 b9 b10 b10 b10 b10
        s0[3] = _mm256_bsrli_epi128(r0, 6);

        __m256i res_out_0[2];
        res_out_0[0] = res_out_0[1] = zero;
        resize_convolve(s0, coeffs_x, res_out_0);

        // r00 - r03 | r10 - r13
        __m256i res_out =
            _mm256_permute2x128_si256(res_out_0[0], res_out_0[1], 0x20);
        // r00 - r03 | r10 - r13
        res_out = _mm256_sra_epi32(_mm256_add_epi32(res_out, round_const_bits),
                                   round_shift_bits);
        // r00-r03 r00-r03 r10-r13 r10-r13
        __m256i res_out_row01 = _mm256_packus_epi32(res_out, res_out);
        // r00-r03 r00-r03 r00-r03 r00-r03 r10-r13 r10-r13 r10-r13 r10-r13
        res_out_row01 = _mm256_packus_epi16(res_out_row01, res_out_row01);
        res_out_row01 = _mm256_min_epu8(res_out_row01, clip_pixel);
        res_out_row01 = _mm256_max_epu8(res_out_row01, zero);

        xx_storel_32(intbuf + out_idx, CAST_LOW(res_out_row01));
        xx_storel_32(intbuf + out_idx + dst_stride,
                     _mm256_extracti128_si256(res_out_row01, 1));
      }

      wd_processed = filtered_length - remain_col;
      if (remain_col) {
        const int in_idx = (in_stride * i);
        const int out_idx = (wd_processed / 2) + width2 * i;

        down2_symeven(input + in_idx, filtered_length, intbuf + out_idx,
                      wd_processed);
        down2_symeven(input + in_idx + in_stride, filtered_length,
                      intbuf + out_idx + width2, wd_processed);
      }
    }
  }
}